

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editcol.c
# Opt level: O0

int ffrwrg(char *rowlist,LONGLONG maxrows,int maxranges,int *numranges,long *minrow,long *maxrow,
          int *status)

{
  ushort **ppuVar1;
  int *in_RCX;
  int in_EDX;
  long in_RSI;
  char *in_RDI;
  undefined8 *in_R8;
  long *in_R9;
  long maxval;
  long minval;
  char *next;
  long local_50;
  long local_48;
  char *local_40;
  long *local_38;
  undefined8 *local_30;
  int *local_28;
  int local_1c;
  long local_18;
  int local_4;
  
  if (*(int *)maxval < 1) {
    if (in_RSI < 1) {
      *(undefined4 *)maxval = 0x7e;
      ffpmsg((char *)0x11dc7f);
      local_4 = *(int *)maxval;
    }
    else {
      *in_RCX = 0;
      for (local_40 = in_RDI; local_38 = in_R9, local_30 = in_R8, local_28 = in_RCX,
          local_1c = in_EDX, local_18 = in_RSI, *local_40 == ' '; local_40 = local_40 + 1) {
      }
      while (*local_40 != '\0') {
        if (*local_40 == '-') {
          local_48 = 1;
        }
        else {
          ppuVar1 = __ctype_b_loc();
          if (((*ppuVar1)[(int)*local_40] & 0x800) == 0) {
            *(undefined4 *)maxval = 0x7e;
            ffpmsg((char *)0x11dd3f);
            ffpmsg((char *)0x11dd49);
            return *(int *)maxval;
          }
          local_48 = strtol(local_40,&local_40,10);
        }
        for (; *local_40 == ' '; local_40 = local_40 + 1) {
        }
        if (*local_40 == '-') {
          do {
            local_40 = local_40 + 1;
          } while (*local_40 == ' ');
          ppuVar1 = __ctype_b_loc();
          if (((*ppuVar1)[(int)*local_40] & 0x800) == 0) {
            if ((*local_40 != ',') && (*local_40 != '\0')) {
              *(undefined4 *)maxval = 0x7e;
              ffpmsg((char *)0x11de2f);
              ffpmsg((char *)0x11de39);
              return *(int *)maxval;
            }
            local_50 = local_18;
          }
          else {
            local_50 = strtol(local_40,&local_40,10);
          }
        }
        else {
          if ((*local_40 != ',') && (*local_40 != '\0')) {
            *(undefined4 *)maxval = 0x7e;
            ffpmsg((char *)0x11de8a);
            ffpmsg((char *)0x11de94);
            return *(int *)maxval;
          }
          local_50 = local_48;
        }
        if (local_1c < *local_28 + 1) {
          *(undefined4 *)maxval = 0x7e;
          ffpmsg((char *)0x11decd);
          return *(int *)maxval;
        }
        if (local_48 < 1) {
          *(undefined4 *)maxval = 0x7e;
          ffpmsg((char *)0x11defc);
          ffpmsg((char *)0x11df06);
          return *(int *)maxval;
        }
        if (local_50 < local_48) {
          *(undefined4 *)maxval = 0x7e;
          ffpmsg((char *)0x11df39);
          ffpmsg((char *)0x11df43);
          return *(int *)maxval;
        }
        if ((0 < *local_28) && (local_48 <= local_38[*local_28 + -1])) {
          *(undefined4 *)maxval = 0x7e;
          ffpmsg((char *)0x11df91);
          ffpmsg((char *)0x11df9d);
          ffpmsg((char *)0x11dfa7);
          return *(int *)maxval;
        }
        if (local_48 <= local_18) {
          if (local_18 < local_50) {
            local_50 = local_18;
          }
          local_30[*local_28] = local_48;
          local_38[*local_28] = local_50;
          *local_28 = *local_28 + 1;
        }
        for (; *local_40 == ' '; local_40 = local_40 + 1) {
        }
        if (*local_40 == ',') {
          do {
            local_40 = local_40 + 1;
          } while (*local_40 == ' ');
        }
      }
      if (*local_28 == 0) {
        *local_30 = 1;
        *local_38 = local_18;
        *local_28 = 1;
      }
      local_4 = *(int *)maxval;
    }
  }
  else {
    local_4 = *(int *)maxval;
  }
  return local_4;
}

Assistant:

int ffrwrg(
      char *rowlist,      /* I - list of rows and row ranges */
      LONGLONG maxrows,       /* I - number of rows in the table */
      int maxranges,     /* I - max number of ranges to be returned */
      int *numranges,    /* O - number ranges returned */
      long *minrow,       /* O - first row in each range */
      long *maxrow,       /* O - last row in each range */
      int *status)        /* IO - status value */
{
/*
   parse the input list of row ranges, returning the number of ranges,
   and the min and max row value in each range. 

   The only characters allowed in the input rowlist are 
       decimal digits, minus sign, and comma (and non-significant spaces) 

   Example:  

     list = "10-20, 30-35,50"

   would return numranges = 3, minrow[] = {10, 30, 50}, maxrow[] = {20, 35, 50}

   error is returned if min value of range is > max value of range or if the
   ranges are not monotonically increasing.
*/
    char *next;
    long minval, maxval;

    if (*status > 0)
        return(*status);

    if (maxrows <= 0 ) {
        *status = RANGE_PARSE_ERROR;
        ffpmsg("Input maximum range value is <= 0 (fits_parse_ranges)");
        return(*status);
    }

    next = rowlist;
    *numranges = 0;

    while (*next == ' ')next++;   /* skip spaces */
   
    while (*next != '\0') {

      /* find min value of next range; *next must be '-' or a digit */
      if (*next == '-') {
          minval = 1;    /* implied minrow value = 1 */
      } else if ( isdigit((int) *next) ) {
          minval = strtol(next, &next, 10);
      } else {
          *status = RANGE_PARSE_ERROR;
          ffpmsg("Syntax error in this row range list:");
          ffpmsg(rowlist);
          return(*status);
      }

      while (*next == ' ')next++;   /* skip spaces */

      /* find max value of next range; *next must be '-', or ',' */
      if (*next == '-') {
          next++;
          while (*next == ' ')next++;   /* skip spaces */

          if ( isdigit((int) *next) ) {
              maxval = strtol(next, &next, 10);
          } else if (*next == ',' || *next == '\0') {
              maxval = (long) maxrows;  /* implied max value */
          } else {
              *status = RANGE_PARSE_ERROR;
              ffpmsg("Syntax error in this row range list:");
              ffpmsg(rowlist);
              return(*status);
          }
      } else if (*next == ',' || *next == '\0') {
          maxval = minval;  /* only a single integer in this range */
      } else {
          *status = RANGE_PARSE_ERROR;
          ffpmsg("Syntax error in this row range list:");
          ffpmsg(rowlist);
          return(*status);
      }

      if (*numranges + 1 > maxranges) {
          *status = RANGE_PARSE_ERROR;
          ffpmsg("Overflowed maximum number of ranges (fits_parse_ranges)");
          return(*status);
      }

      if (minval < 1 ) {
          *status = RANGE_PARSE_ERROR;
          ffpmsg("Syntax error in this row range list: row number < 1");
          ffpmsg(rowlist);
          return(*status);
      }

      if (maxval < minval) {
          *status = RANGE_PARSE_ERROR;
          ffpmsg("Syntax error in this row range list: min > max");
          ffpmsg(rowlist);
          return(*status);
      }

      if (*numranges > 0) {
          if (minval <= maxrow[(*numranges) - 1]) {
             *status = RANGE_PARSE_ERROR;
             ffpmsg("Syntax error in this row range list.  Range minimum is");
             ffpmsg("  less than or equal to previous range maximum");
             ffpmsg(rowlist);
             return(*status);
         }
      }

      if (minval <= maxrows) {   /* ignore range if greater than maxrows */
          if (maxval > maxrows)
              maxval = (long) maxrows;

           minrow[*numranges] = minval;
           maxrow[*numranges] = maxval;

           (*numranges)++;
      }

      while (*next == ' ')next++;   /* skip spaces */
      if (*next == ',') {
           next++;
           while (*next == ' ')next++;   /* skip more spaces */
      }
    }

    if (*numranges == 0) {  /* a null string was entered */
         minrow[0] = 1;
         maxrow[0] = (long) maxrows;
         *numranges = 1;
    }

    return(*status);
}